

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Bool.cpp
# Opt level: O2

void __thiscall Bool::display(Bool *this)

{
  ostream *poVar1;
  
  poVar1 = std::operator<<((ostream *)&std::cout,"cited: ");
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)&std::cout,"type : bool");
  std::endl<char,std::char_traits<char>>(poVar1);
  std::operator<<((ostream *)&std::cout,"value: ");
  (*(this->super_Data)._vptr_Data[2])(this);
  std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  return;
}

Assistant:

void Bool::display() {
    std::cout << "cited: " << cited << std::endl;
    std::cout << "type : bool" << std::endl;
    std::cout << "value: ";
    print();
    std::cout << std::endl;
    std::cout << std::endl;
}